

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O0

window * __thiscall hmi::window::operator=(window *this,window *other)

{
  SDL_Window **in_RSI;
  window *in_RDI;
  
  std::swap<SDL_Window*>(&in_RDI->m_window,in_RSI);
  std::swap<bool>(&in_RDI->m_should_close,(bool *)(in_RSI + 1));
  LOCK();
  (anonymous_namespace)::g_loaded = (anonymous_namespace)::g_loaded + 1;
  UNLOCK();
  return in_RDI;
}

Assistant:

window& window::operator=(window&& other) {
    std::swap(m_window, other.m_window);
    std::swap(m_should_close, other.m_should_close);
    g_loaded.fetch_add(1);
    return *this;
  }